

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte *srcBuffer;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  undefined1 *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  BitContainerType BVar18;
  undefined1 *puVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong *puVar23;
  undefined1 *puVar24;
  int iVar25;
  undefined1 *puVar26;
  int iVar27;
  undefined4 in_register_0000008c;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  uint uStack_134;
  ulong *puStack_130;
  ulong uStack_128;
  ulong *puStack_108;
  ulong uStack_100;
  ulong uStack_f0;
  uint uStack_e4;
  BIT_DStream_t BStack_e0;
  undefined1 *puStack_b8;
  ulong *puStack_b0;
  ulong *puStack_a8;
  undefined1 *puStack_a0;
  undefined1 *puStack_98;
  undefined1 *puStack_88;
  ulong *puStack_80;
  ulong *puStack_78;
  ulong *puStack_70;
  ulong *puStack_68;
  ulong uStack_60;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar10 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar10;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar10 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,maxDstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (maxDstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar30 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar13 = (ulong)uVar5;
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar11 = (ulong)uVar6;
  uVar16 = uVar30 + uVar13 + uVar11 + 6;
  if (cSrcSize < uVar16) {
    return 0xffffffffffffffec;
  }
  puStack_a0 = (undefined1 *)(maxDstSize + (long)dst);
  uStack_60 = maxDstSize + 3 >> 2;
  puStack_88 = (undefined1 *)(uStack_60 + (long)dst);
  puStack_98 = puStack_88 + uStack_60;
  puStack_b8 = puStack_98 + uStack_60;
  if (puStack_a0 < puStack_b8) {
    return 0xffffffffffffffec;
  }
  puStack_a8 = (ulong *)((long)cSrc + uVar30 + 6);
  if (uVar30 == 0) {
    uVar17 = 0xffffffffffffffb8;
    puStack_108 = (ulong *)0x0;
    puVar23 = (ulong *)0x0;
    puStack_70 = (ulong *)0x0;
    uVar29 = 0;
    uStack_128 = 0;
  }
  else {
    puVar23 = (ulong *)((long)cSrc + 6);
    puStack_70 = (ulong *)((long)cSrc + 0xe);
    if (uVar4 < 8) {
      uStack_128 = (ulong)*(byte *)puVar23;
      switch(uVar4) {
      case 7:
        uStack_128 = uStack_128 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      case 6:
        uStack_128 = uStack_128 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        uStack_128 = uStack_128 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      case 4:
        uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
      case 2:
        uStack_128 = uStack_128 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar12 = *(byte *)((long)cSrc + uVar30 + 5);
        uVar28 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        if (bVar12 == 0) {
          uVar17 = 0xffffffffffffffec;
          uVar28 = 0;
        }
        else {
          uVar28 = ~uVar28 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
          uVar17 = uVar30;
        }
        uVar29 = (ulong)uVar28;
        puStack_108 = puVar23;
      }
    }
    else {
      uStack_128 = *(ulong *)((long)cSrc + (uVar30 - 2));
      bVar12 = *(byte *)((long)cSrc + uVar30 + 5);
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = ~uVar28 + 9;
      if (bVar12 == 0) {
        uVar28 = 0;
      }
      uVar29 = (ulong)uVar28;
      uVar17 = uVar30 | -(ulong)(bVar12 == 0);
      puStack_108 = (ulong *)((long)cSrc + (uVar30 - 2));
    }
  }
  if (0xffffffffffffff88 < uVar17) {
    return uVar17;
  }
  puStack_68 = (ulong *)((long)puStack_a8 + uVar13);
  if (uVar13 == 0) {
    uVar13 = 0xffffffffffffffb8;
    uStack_f0 = 0;
    uStack_134 = 0;
    puStack_b0 = (ulong *)0x0;
    puStack_a8 = (ulong *)0x0;
    puStack_78 = (ulong *)0x0;
  }
  else {
    puStack_78 = (ulong *)((long)cSrc + uVar30 + 0xe);
    if (7 < uVar5) {
      uStack_f0 = puStack_68[-1];
      bVar12 = *(byte *)((long)puStack_68 + -1);
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uStack_134 = ~uVar28 + 9;
      if (bVar12 == 0) {
        uStack_134 = 0;
      }
      uVar13 = uVar13 | -(ulong)(bVar12 == 0);
      puStack_b0 = puStack_68 + -1;
      goto LAB_01dbabbf;
    }
    uStack_f0 = (ulong)(byte)*puStack_a8;
    switch(uVar5) {
    case 2:
      break;
    case 7:
      uStack_f0 = uStack_f0 | (ulong)*(byte *)((long)cSrc + uVar30 + 0xc) << 0x30;
    case 6:
      uStack_f0 = uStack_f0 + ((ulong)*(byte *)((long)cSrc + uVar30 + 0xb) << 0x28);
    case 5:
      uStack_f0 = uStack_f0 + ((ulong)*(byte *)((long)cSrc + uVar30 + 10) << 0x20);
    case 4:
      uStack_f0 = uStack_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 9) * 0x1000000;
    case 3:
      uStack_f0 = uStack_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 8) * 0x10000;
      break;
    default:
      goto switchD_01dbab21_default;
    }
    uStack_f0 = uStack_f0 + (ulong)*(byte *)((long)cSrc + uVar30 + 7) * 0x100;
switchD_01dbab21_default:
    bVar12 = *(byte *)((long)puStack_68 + -1);
    uVar28 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
      }
    }
    puStack_b0 = puStack_a8;
    if (bVar12 == 0) {
      uVar13 = 0xffffffffffffffec;
      uStack_134 = 0;
    }
    else {
      uStack_134 = ~uVar28 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
    }
  }
LAB_01dbabbf:
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  srcBuffer = (byte *)((long)puStack_68 + uVar11);
  if (uVar11 == 0) {
    uVar11 = 0xffffffffffffffb8;
    uStack_100 = 0;
    uStack_e4 = 0;
    puStack_130 = (ulong *)0x0;
    puStack_68 = (ulong *)0x0;
    puStack_80 = (ulong *)0x0;
  }
  else {
    puStack_80 = puStack_68 + 1;
    if (uVar6 < 8) {
      uStack_100 = (ulong)(byte)*puStack_68;
      switch(uVar6) {
      case 7:
        uStack_100 = uStack_100 | (ulong)*(byte *)((long)puStack_68 + 6) << 0x30;
      case 6:
        uStack_100 = uStack_100 + ((ulong)*(byte *)((long)puStack_68 + 5) << 0x28);
      case 5:
        uStack_100 = uStack_100 + ((ulong)*(byte *)((long)puStack_68 + 4) << 0x20);
      case 4:
        uStack_100 = uStack_100 + (ulong)*(byte *)((long)puStack_68 + 3) * 0x1000000;
      case 3:
        uStack_100 = uStack_100 + (ulong)*(byte *)((long)puStack_68 + 2) * 0x10000;
      case 2:
        uStack_100 = uStack_100 + (ulong)*(byte *)((long)puStack_68 + 1) * 0x100;
      default:
        bVar12 = srcBuffer[-1];
        uVar28 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        puStack_130 = puStack_68;
        if (bVar12 == 0) {
          uVar11 = 0xffffffffffffffec;
          uStack_e4 = 0;
        }
        else {
          uStack_e4 = ~uVar28 + 9 + ((uint)uVar6 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      uStack_100 = *(ulong *)(srcBuffer + -8);
      bVar12 = srcBuffer[-1];
      uVar28 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uStack_e4 = ~uVar28 + 9;
      if (bVar12 == 0) {
        uStack_e4 = 0;
      }
      uVar11 = uVar11 | -(ulong)(bVar12 == 0);
      puStack_130 = (ulong *)(srcBuffer + -8);
    }
  }
  if (0xffffffffffffff88 < uVar11) {
    return uVar11;
  }
  uVar7 = *(undefined2 *)((long)DTable + 2);
  sVar10 = BIT_initDStream(&BStack_e0,srcBuffer,cSrcSize - uVar16);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puVar14 = (undefined1 *)((long)dst + (maxDstSize - 3));
  cVar9 = (char)uVar7;
  puVar24 = puStack_98;
  puVar26 = puStack_88;
  puVar19 = puStack_b8;
  if (puStack_b8 < puVar14 && 7 < (ulong)((long)puStack_a0 - (long)puStack_b8)) {
    bVar12 = -cVar9 & 0x3f;
    lVar8 = uStack_60 * 3;
    BVar18 = BStack_e0.bitContainer;
    do {
      puVar24 = (undefined1 *)dst;
      uVar11 = (uStack_128 << ((byte)uVar29 & 0x3f)) >> bVar12;
      uVar13 = (uStack_f0 << ((byte)uStack_134 & 0x3f)) >> bVar12;
      uVar16 = (uStack_100 << ((byte)uStack_e4 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + (int)uVar29;
      uVar30 = (BVar18 << ((byte)BStack_e0.bitsConsumed & 0x3f)) >> bVar12;
      uVar17 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar22 = *(byte *)((long)DTable + uVar13 * 2 + 4) + uStack_134;
      puVar24[uStack_60] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar25 = *(byte *)((long)DTable + uVar16 * 2 + 4) + uStack_e4;
      puVar24[uStack_60 * 2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      iVar27 = *(byte *)((long)DTable + uVar30 * 2 + 4) + BStack_e0.bitsConsumed;
      puVar24[lVar8] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      uVar11 = (uStack_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      uVar30 = (uStack_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar20;
      uVar13 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      uVar16 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar22 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar22;
      puVar24[uStack_60 + 1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar25;
      puVar24[uStack_60 * 2 + 1] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      iVar27 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar27;
      puVar24[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar20;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      uVar11 = (uStack_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      uVar13 = (uStack_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      iVar22 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar22;
      uVar16 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      uVar30 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[uStack_60 + 2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar25;
      puVar24[uStack_60 * 2 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar27 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar27;
      puVar24[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar16 * 2 + 5);
      uVar28 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar20;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      uVar11 = (uStack_f0 << ((byte)iVar22 & 0x3f)) >> bVar12;
      bVar1 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar24[uStack_60 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (uStack_100 << ((byte)iVar25 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar24[uStack_60 * 2 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BVar18 << ((byte)iVar27 & 0x3f)) >> bVar12;
      bVar3 = *(byte *)((long)DTable + uVar11 * 2 + 4);
      puVar24[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar20 = 3;
      if (puStack_108 < puStack_70) {
        iVar21 = 3;
      }
      else {
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)(uVar28 >> 3));
        uVar28 = uVar28 & 7;
        uStack_128 = *puStack_108;
        iVar21 = 0;
      }
      uVar29 = (ulong)uVar28;
      uStack_134 = iVar22 + (uint)bVar1;
      if (puStack_78 <= puStack_b0) {
        puStack_b0 = (ulong *)((long)puStack_b0 - (ulong)(uStack_134 >> 3));
        uStack_134 = uStack_134 & 7;
        uStack_f0 = *puStack_b0;
        iVar20 = 0;
      }
      uStack_e4 = iVar25 + (uint)bVar2;
      iVar25 = 3;
      if (puStack_130 < puStack_80) {
        iVar22 = 3;
      }
      else {
        puStack_130 = (ulong *)((long)puStack_130 - (ulong)(uStack_e4 >> 3));
        uStack_e4 = uStack_e4 & 7;
        uStack_100 = *puStack_130;
        iVar22 = 0;
      }
      BStack_e0.bitsConsumed = iVar27 + (uint)bVar3;
      if (BStack_e0.limitPtr <= BStack_e0.ptr) {
        BStack_e0.ptr = (char *)((long)BStack_e0.ptr - (ulong)(BStack_e0.bitsConsumed >> 3));
        BStack_e0.bitsConsumed = BStack_e0.bitsConsumed & 7;
        BVar18 = *(BitContainerType *)BStack_e0.ptr;
        iVar25 = 0;
        BStack_e0.bitContainer = BVar18;
      }
    } while ((puVar24 + lVar8 + 4 < puVar14) &&
            (dst = puVar24 + 4, ((iVar20 == 0 && iVar21 == 0) && iVar22 == 0) && iVar25 == 0));
    dst = puVar24 + 4;
    puVar24 = (undefined1 *)((long)dst + uStack_60 * 2);
    puVar26 = (undefined1 *)((long)dst + uStack_60);
    puVar19 = (undefined1 *)((long)dst + lVar8);
  }
  if ((puStack_88 < dst) || (puStack_98 < puVar26)) {
    return 0xffffffffffffffec;
  }
  if (puStack_b8 < puVar24) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)puStack_88 - (long)dst) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar28 = (uint)uVar29;
      if (uVar28 < 0x41) {
        if (puStack_108 < puStack_70) {
          if (puStack_108 == puVar23) {
            bVar31 = false;
            goto LAB_01dbb284;
          }
          bVar31 = puVar23 <= (ulong *)((long)puStack_108 - (uVar29 >> 3));
          uVar15 = (int)puStack_108 - (int)puVar23;
          if (bVar31) {
            uVar15 = (uint)(uVar29 >> 3);
          }
          uVar28 = uVar28 + uVar15 * -8;
        }
        else {
          uVar15 = (uint)(uVar29 >> 3);
          uVar28 = uVar28 & 7;
          bVar31 = true;
        }
        uVar29 = (ulong)uVar28;
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar15);
        uStack_128 = *puStack_108;
      }
      else {
        bVar31 = false;
        puStack_108 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb284:
      if ((puStack_88 + -3 <= dst) || (!bVar31)) goto LAB_01dbb3d6;
      uVar11 = (uStack_128 << ((byte)uVar29 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + (int)uVar29;
      uVar13 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar11 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (uStack_128 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uVar29 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar28 = (uint)uVar29;
  if (uVar28 < 0x41) {
    if (puStack_108 < puStack_70) {
      if (puStack_108 == puVar23) goto LAB_01dbb3d6;
      uVar15 = (int)puStack_108 - (int)puVar23;
      if (puVar23 <= (ulong *)((long)puStack_108 - (uVar29 >> 3))) {
        uVar15 = (uint)(uVar29 >> 3);
      }
      uVar28 = uVar28 + uVar15 * -8;
    }
    else {
      uVar15 = (uint)(uVar29 >> 3);
      uVar28 = uVar28 & 7;
    }
    uVar29 = (ulong)uVar28;
    puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar15);
    uStack_128 = *puStack_108;
  }
  else {
    puStack_108 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb3d6:
  uVar28 = (uint)uVar29;
  if (dst < puStack_88) {
    do {
      uVar11 = (uStack_128 << ((byte)uVar29 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar28 = (int)uVar29 + (uint)*(byte *)((long)DTable + uVar11 * 2 + 4);
      uVar29 = (ulong)uVar28;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puStack_88);
  }
  if (3 < (long)puStack_98 - (long)puVar26) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (uStack_134 < 0x41) {
        if (puStack_b0 < puStack_78) {
          if (puStack_b0 == puStack_a8) {
            bVar31 = false;
            goto LAB_01dbb4e7;
          }
          bVar31 = puStack_a8 <= (ulong *)((long)puStack_b0 - (ulong)(uStack_134 >> 3));
          uVar15 = (int)puStack_b0 - (int)puStack_a8;
          if (bVar31) {
            uVar15 = uStack_134 >> 3;
          }
          uStack_134 = uStack_134 + uVar15 * -8;
        }
        else {
          uVar15 = uStack_134 >> 3;
          uStack_134 = uStack_134 & 7;
          bVar31 = true;
        }
        puStack_b0 = (ulong *)((long)puStack_b0 - (ulong)uVar15);
        uStack_f0 = *puStack_b0;
      }
      else {
        bVar31 = false;
        puStack_b0 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb4e7:
      if ((puStack_98 + -3 <= puVar26) || (!bVar31)) goto LAB_01dbb616;
      uVar11 = (uStack_f0 << ((byte)uStack_134 & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uStack_134;
      uVar13 = (uStack_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar26 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar11 = (uStack_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar26[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar26[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (uStack_f0 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uStack_134 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar26[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar26 = puVar26 + 4;
    } while( true );
  }
  if (uStack_134 < 0x41) {
    if (puStack_b0 < puStack_78) {
      if (puStack_b0 == puStack_a8) goto LAB_01dbb616;
      uVar15 = (int)puStack_b0 - (int)puStack_a8;
      if (puStack_a8 <= (ulong *)((long)puStack_b0 - (ulong)(uStack_134 >> 3))) {
        uVar15 = uStack_134 >> 3;
      }
      uStack_134 = uStack_134 + uVar15 * -8;
    }
    else {
      uVar15 = uStack_134 >> 3;
      uStack_134 = uStack_134 & 7;
    }
    puStack_b0 = (ulong *)((long)puStack_b0 - (ulong)uVar15);
    uStack_f0 = *puStack_b0;
  }
  else {
    puStack_b0 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb616:
  if (puVar26 < puStack_98) {
    do {
      uVar11 = (uStack_f0 << ((byte)uStack_134 & 0x3f)) >> (-cVar9 & 0x3fU);
      uStack_134 = uStack_134 + *(byte *)((long)DTable + uVar11 * 2 + 4);
      *puVar26 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar26 = puVar26 + 1;
    } while (puVar26 < puStack_98);
  }
  if (3 < (long)puStack_b8 - (long)puVar24) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (uStack_e4 < 0x41) {
        if (puStack_130 < puStack_80) {
          if (puStack_130 == puStack_68) {
            bVar31 = false;
            goto LAB_01dbb70e;
          }
          bVar31 = puStack_68 <= (ulong *)((long)puStack_130 - (ulong)(uStack_e4 >> 3));
          uVar15 = (int)puStack_130 - (int)puStack_68;
          if (bVar31) {
            uVar15 = uStack_e4 >> 3;
          }
          uStack_e4 = uStack_e4 + uVar15 * -8;
        }
        else {
          uVar15 = uStack_e4 >> 3;
          uStack_e4 = uStack_e4 & 7;
          bVar31 = true;
        }
        puStack_130 = (ulong *)((long)puStack_130 - (ulong)uVar15);
        uStack_100 = *puStack_130;
      }
      else {
        bVar31 = false;
        puStack_130 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_01dbb70e:
      if ((puStack_b8 + -3 <= puVar24) || (!bVar31)) goto LAB_01dbb857;
      uVar11 = (uStack_100 << ((byte)uStack_e4 & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar11 * 2 + 4) + uStack_e4;
      uVar13 = (uStack_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar20;
      uVar11 = (uStack_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (uStack_100 << ((byte)iVar20 & 0x3f)) >> bVar12;
      uStack_e4 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar24 = puVar24 + 4;
    } while( true );
  }
  if (uStack_e4 < 0x41) {
    if (puStack_130 < puStack_80) {
      if (puStack_130 == puStack_68) goto LAB_01dbb857;
      uVar15 = (int)puStack_130 - (int)puStack_68;
      if (puStack_68 <= (ulong *)((long)puStack_130 - (ulong)(uStack_e4 >> 3))) {
        uVar15 = uStack_e4 >> 3;
      }
      uStack_e4 = uStack_e4 + uVar15 * -8;
    }
    else {
      uVar15 = uStack_e4 >> 3;
      uStack_e4 = uStack_e4 & 7;
    }
    puStack_130 = (ulong *)((long)puStack_130 - (ulong)uVar15);
    uStack_100 = *puStack_130;
  }
  else {
    puStack_130 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01dbb857:
  if (puVar24 < puStack_b8) {
    do {
      uVar11 = (uStack_100 << ((byte)uStack_e4 & 0x3f)) >> (-cVar9 & 0x3fU);
      uStack_e4 = uStack_e4 + *(byte *)((long)DTable + uVar11 * 2 + 4);
      *puVar24 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar24 = puVar24 + 1;
    } while (puVar24 < puStack_b8);
  }
  if (3 < (long)puStack_a0 - (long)puVar19) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (BStack_e0.bitsConsumed < 0x41) {
        if (BStack_e0.ptr < BStack_e0.limitPtr) {
          if (BStack_e0.ptr == BStack_e0.start) goto LAB_01dbb94b;
          bVar31 = BStack_e0.start <=
                   (BitContainerType *)((long)BStack_e0.ptr - (ulong)(BStack_e0.bitsConsumed >> 3));
          uVar15 = (int)BStack_e0.ptr - (int)BStack_e0.start;
          if (bVar31) {
            uVar15 = BStack_e0.bitsConsumed >> 3;
          }
          BStack_e0.ptr = (char *)((long)BStack_e0.ptr - (ulong)uVar15);
          BStack_e0.bitsConsumed = BStack_e0.bitsConsumed + uVar15 * -8;
          BStack_e0.bitContainer = *(BitContainerType *)BStack_e0.ptr;
        }
        else {
          BStack_e0.ptr = (char *)((long)BStack_e0.ptr - (ulong)(BStack_e0.bitsConsumed >> 3));
          BStack_e0.bitsConsumed = BStack_e0.bitsConsumed & 7;
          BStack_e0.bitContainer = *(BitContainerType *)BStack_e0.ptr;
          bVar31 = true;
        }
      }
      else {
        BStack_e0.ptr = "";
LAB_01dbb94b:
        bVar31 = false;
      }
      if ((puVar14 <= puVar19) || (!bVar31)) goto LAB_01dbbadd;
      uVar11 = (BStack_e0.bitContainer << ((byte)BStack_e0.bitsConsumed & 0x3f)) >> bVar12;
      iVar20 = *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_e0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar19[1] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      iVar20 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar19[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      uVar11 = (BStack_e0.bitContainer << ((byte)iVar20 & 0x3f)) >> bVar12;
      BStack_e0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar20;
      puVar19[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar19 = puVar19 + 4;
    } while( true );
  }
  if (BStack_e0.bitsConsumed < 0x41) {
    if (BStack_e0.ptr < BStack_e0.limitPtr) {
      if (BStack_e0.ptr == BStack_e0.start) goto LAB_01dbbadd;
      uVar15 = (int)BStack_e0.ptr - (int)BStack_e0.start;
      if (BStack_e0.start <=
          (BitContainerType *)((long)BStack_e0.ptr - (ulong)(BStack_e0.bitsConsumed >> 3))) {
        uVar15 = BStack_e0.bitsConsumed >> 3;
      }
      BStack_e0.bitsConsumed = BStack_e0.bitsConsumed + uVar15 * -8;
    }
    else {
      uVar15 = BStack_e0.bitsConsumed >> 3;
      BStack_e0.bitsConsumed = BStack_e0.bitsConsumed & 7;
    }
    BStack_e0.ptr = (char *)((long)BStack_e0.ptr - (ulong)uVar15);
    BStack_e0.bitContainer = *(BitContainerType *)BStack_e0.ptr;
  }
  else {
    BStack_e0.ptr = "";
  }
LAB_01dbbadd:
  if (puVar19 < puStack_a0) {
    do {
      uVar11 = (BStack_e0.bitContainer << ((byte)BStack_e0.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU)
      ;
      BStack_e0.bitsConsumed = *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_e0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)DTable + uVar11 * 2 + 5);
      puVar19 = puVar19 + 1;
    } while (puVar19 < puStack_a0);
  }
  if (BStack_e0.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_e0.ptr != BStack_e0.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_e4 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_130 != puStack_68) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_134 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_b0 != puStack_a8) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uVar28 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_108 != puVar23) {
    maxDstSize = 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}